

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526Storage.hpp
# Opt level: O0

uint8_t __thiscall MOS::MOS6526::TODStorage<true>::read<1>(TODStorage<true> *this)

{
  uint8_t uStack_2b;
  uint8_t result;
  uint32_t source;
  int shift;
  TODStorage<true> *this_local;
  
  if (this->latch_ == 0) {
    uStack_2b = (uint8_t)(this->value_ >> 8);
  }
  else {
    uStack_2b = (uint8_t)(this->latch_ >> 8);
  }
  return uStack_2b;
}

Assistant:

uint8_t read() {
			if constexpr (byte == 3) {
				return 0xff;	// Assumed. Just a guess.
			}
			constexpr int shift = byte << 3;

			if constexpr (byte == 2) {
				latch_ = value_ | 0xff00'0000;
			}

			const uint32_t source = latch_ ? latch_ : value_;
			const uint8_t result = uint8_t((source >> shift) & 0xff);

			if constexpr (byte == 0) {
				latch_ = 0;
			}

			return result;
		}